

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O3

bool __thiscall IR::PropertySymOpnd::NeedsLocalTypeCheck(PropertySymOpnd *this)

{
  code *pcVar1;
  anon_union_2_2_18881db1_for_PropertySymOpnd_13 aVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((this->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     ((bVar3 = IsTypeCheckSeqCandidate(this), !bVar3 && (((ushort)this->field_12 & 2) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x460,"(MayNeedTypeCheckProtection())","MayNeedTypeCheckProtection()");
    if (!bVar3) goto LAB_003ee7bd;
    *puVar4 = 0;
  }
  bVar3 = IsTypeCheckSeqCandidate(this);
  if ((!bVar3) && (((this->field_12).field_0.field_5.typeCheckSeqFlags & 0x4e) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x461,"(TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "TypeCheckSeqBitsSetOnlyIfCandidate()");
    if (!bVar3) {
LAB_003ee7bd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,ObjTypeSpecIsolatedFldOpsPhase);
  if (((bVar3) || (bVar3 = IsTypeCheckSeqCandidate(this), !bVar3)) ||
     (aVar2 = (anon_union_2_2_18881db1_for_PropertySymOpnd_13)(this->field_12).objTypeSpecFlags,
     ((ushort)aVar2 & 0x400) == 0)) {
    return false;
  }
  if (((ushort)aVar2 & 0x800) != 0) {
    return false;
  }
  if (((ushort)this->field_12 & 1) != 0) {
    return false;
  }
  return ((ushort)aVar2 & 0x2000) == 0;
}

Assistant:

bool NeedsLocalTypeCheck() const
    {
        Assert(MayNeedTypeCheckProtection());
        Assert(TypeCheckSeqBitsSetOnlyIfCandidate());
        // Indicate whether this operation needs a type check for its own sake, since the type is dead and no downstream
        // operations require the type to be checked.
        return !PHASE_OFF1(Js::ObjTypeSpecIsolatedFldOpsPhase) &&
            IsTypeCheckSeqCandidate() && IsTypeDead() && !IsTypeCheckOnly() && !IsTypeChecked() && !HasTypeMismatch();
    }